

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O2

ostream * operator<<(ostream *os,strings *s)

{
  string local_68;
  string local_48;
  string local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  wire::strings::str(&local_28,s,"\x01\n",&local_48,&local_68);
  std::operator<<(os,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return os;
}

Assistant:

std::ostream &operator <<( std::ostream &os, const wire::strings &s )
{
    os << s.str();
    return os;
}